

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_crecord.c
# Opt level: O2

CTypeID crec_bit64_type(CTState *cts,cTValue *tv)

{
  CTypeID CVar1;
  CType *pCVar2;
  uint uVar3;
  
  CVar1 = 0;
  if ((tv->field_4).it >> 0xf == 0x1fff5) {
    pCVar2 = lj_ctype_rawref(cts,(uint)*(ushort *)(((ulong)tv->field_4 & 0x7fffffffffff) + 10));
    uVar3 = pCVar2->info;
    if ((uVar3 & 0xf0000000) == 0x50000000) {
      pCVar2 = cts->tab + (uVar3 & 0xffff);
      uVar3 = cts->tab[uVar3 & 0xffff].info;
    }
    if (((uVar3 & 0xfc800000) == 0x800000) && (pCVar2->size == 8)) {
      CVar1 = 0xc;
    }
    else {
      CVar1 = 0xb;
    }
  }
  return CVar1;
}

Assistant:

static CTypeID crec_bit64_type(CTState *cts, cTValue *tv)
{
  if (tviscdata(tv)) {
    CType *ct = lj_ctype_rawref(cts, cdataV(tv)->ctypeid);
    if (ctype_isenum(ct->info)) ct = ctype_child(cts, ct);
    if ((ct->info & (CTMASK_NUM|CTF_BOOL|CTF_FP|CTF_UNSIGNED)) ==
	CTINFO(CT_NUM, CTF_UNSIGNED) && ct->size == 8)
      return CTID_UINT64;  /* Use uint64_t, since it has the highest rank. */
    return CTID_INT64;  /* Otherwise use int64_t. */
  }
  return 0;  /* Use regular 32 bit ops. */
}